

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.h
# Opt level: O2

void __thiscall apollonia::Arbiter::AddContact(Arbiter *this,Contact *contact)

{
  std::vector<apollonia::Contact,_std::allocator<apollonia::Contact>_>::push_back
            (&this->contacts_,contact);
  if ((ulong)(((long)(this->contacts_).
                     super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->contacts_).
                    super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x48) < 3) {
    return;
  }
  __assert_fail("contacts_.size() <= kMaxContacts",
                "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.h"
                ,0x35,"void apollonia::Arbiter::AddContact(const Contact &)");
}

Assistant:

void AddContact(const Contact& contact) {
    contacts_.push_back(contact);
    assert(contacts_.size() <= kMaxContacts);
  }